

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AI.cpp
# Opt level: O1

void AI::recommendHitForPlayer(Player *player,int *recommendedHit)

{
  bool bVar1;
  bool bVar2;
  short sVar3;
  time_t tVar4;
  ostream *poVar5;
  int iVar6;
  int j;
  
  bVar1 = false;
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  recommendedHit[0] = -1;
  recommendedHit[1] = -1;
  iVar6 = 1;
  do {
    j = 1;
    do {
      sVar3 = Player::getEnemyCellInfo(player,iVar6,j);
      if ((sVar3 == 300) && (bVar2 = unknownCellsNearby(player,iVar6,j), bVar2)) {
        findUnknownCellNearby(player,iVar6,j,recommendedHit);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"found?: ",8);
        poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        Keyboard::getch();
        bVar1 = true;
        break;
      }
      j = j + 1;
    } while (j != 0xb);
    if ((bVar1) || (iVar6 = iVar6 + 1, iVar6 == 0xb)) {
      if (!bVar1) {
        do {
          iVar6 = rand();
          *recommendedHit = iVar6 % 10 + 1;
          iVar6 = rand();
          iVar6 = iVar6 % 10 + 1;
          recommendedHit[1] = iVar6;
          sVar3 = Player::getEnemyCellInfo(player,*recommendedHit,iVar6);
        } while (sVar3 != 0);
      }
      return;
    }
  } while( true );
}

Assistant:

void AI::recommendHitForPlayer(Player & player, int * recommendedHit) {
    srand(time(NULL));
    recommendedHit[0] = -1;
    recommendedHit[1] = -1;
    bool found = false;
    for(int i = 1; i <= 10; i++)
    {
        for(int j = 1; j <= 10; j++)
        {
            if (player.getEnemyCellInfo(i,j) == Player::SHOOT_CODE && unknownCellsNearby(player, i, j))
            {
                findUnknownCellNearby(player, i, j, recommendedHit);

                found = true;
                std::cout << std::endl << "found?: " <<found << std::endl;
                Keyboard::getch();
                break;
            }
        }
        if(found) break;
    }
    //std::cout << std::endl << "found?: " << (char*) found << std::endl;
    if (!found)
    {

        recommendedHit[0] = rand() % 10 + 1;
        recommendedHit[1] = rand() % 10 + 1;
        while(player.getEnemyCellInfo(recommendedHit[0],recommendedHit[1]) != Player::UNKNOWN_CODE)
        {
            recommendedHit[0] = rand() % 10 + 1;
            recommendedHit[1] = rand() % 10 + 1;
        }
    }
}